

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  int iVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float thickness;
  float fVar11;
  float fVar12;
  
  thickness = sz / 5.0;
  pIVar1 = GImGui->CurrentWindow;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar10 = sz - thickness * 0.5;
  fVar12 = fVar10 / 3.0;
  fVar11 = pos.x + thickness * 0.25 + fVar12;
  fVar10 = (pos.y + thickness * 0.25 + fVar10) - fVar12 * 0.5;
  pIVar2 = pIVar1->DrawList;
  iVar5 = (pIVar2->_Path).Size;
  if (iVar5 == (pIVar2->_Path).Capacity) {
    if (iVar5 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
    pIVar7 = (pIVar2->_Path).Data;
    if (pIVar7 != (ImVec2 *)0x0) {
      memcpy(pIVar6,pIVar7,(long)(pIVar2->_Path).Size << 3);
      pIVar7 = (pIVar2->_Path).Data;
      if (pIVar7 != (ImVec2 *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
    }
    (pIVar2->_Path).Data = pIVar6;
    (pIVar2->_Path).Capacity = iVar9;
    iVar5 = (pIVar2->_Path).Size;
  }
  else {
    pIVar6 = (pIVar2->_Path).Data;
  }
  IVar4.y = fVar10 - fVar12;
  IVar4.x = fVar11 - fVar12;
  pIVar6[iVar5] = IVar4;
  (pIVar2->_Path).Size = (pIVar2->_Path).Size + 1;
  pIVar2 = pIVar1->DrawList;
  iVar5 = (pIVar2->_Path).Size;
  if (iVar5 == (pIVar2->_Path).Capacity) {
    if (iVar5 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
    pIVar7 = (pIVar2->_Path).Data;
    if (pIVar7 != (ImVec2 *)0x0) {
      memcpy(pIVar6,pIVar7,(long)(pIVar2->_Path).Size << 3);
      pIVar7 = (pIVar2->_Path).Data;
      if (pIVar7 != (ImVec2 *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
    }
    (pIVar2->_Path).Data = pIVar6;
    (pIVar2->_Path).Capacity = iVar9;
    iVar5 = (pIVar2->_Path).Size;
  }
  else {
    pIVar6 = (pIVar2->_Path).Data;
  }
  pIVar6[iVar5].x = fVar11;
  pIVar6[iVar5].y = fVar10;
  (pIVar2->_Path).Size = (pIVar2->_Path).Size + 1;
  pIVar2 = pIVar1->DrawList;
  iVar5 = (pIVar2->_Path).Size;
  if (iVar5 == (pIVar2->_Path).Capacity) {
    if (iVar5 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
    pIVar7 = (pIVar2->_Path).Data;
    if (pIVar7 != (ImVec2 *)0x0) {
      memcpy(pIVar6,pIVar7,(long)(pIVar2->_Path).Size << 3);
      pIVar7 = (pIVar2->_Path).Data;
      if (pIVar7 != (ImVec2 *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
    }
    (pIVar2->_Path).Data = pIVar6;
    (pIVar2->_Path).Capacity = iVar9;
    iVar5 = (pIVar2->_Path).Size;
  }
  else {
    pIVar6 = (pIVar2->_Path).Data;
  }
  IVar3.y = -fVar12 + -fVar12 + fVar10;
  IVar3.x = fVar12 + fVar12 + fVar11;
  pIVar6[iVar5] = IVar3;
  (pIVar2->_Path).Size = (pIVar2->_Path).Size + 1;
  pIVar2 = pIVar1->DrawList;
  ImDrawList::AddPolyline(pIVar2,(pIVar2->_Path).Data,(pIVar2->_Path).Size,col,false,thickness);
  if ((pIVar2->_Path).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar7 = (ImVec2 *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar6 = (pIVar2->_Path).Data;
    if (pIVar6 != (ImVec2 *)0x0) {
      memcpy(pIVar7,pIVar6,(long)(pIVar2->_Path).Size << 3);
      pIVar6 = (pIVar2->_Path).Data;
      if (pIVar6 != (ImVec2 *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
    }
    (pIVar2->_Path).Data = pIVar7;
    (pIVar2->_Path).Capacity = 0;
  }
  (pIVar2->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}